

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O1

void sha256_Update(SHA256_CTX *context,sha2_byte *data,size_t len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  long lVar9;
  void *__dest;
  ulong __n;
  
  if (len == 0) {
    return;
  }
  uVar8 = (uint)context->bitcount >> 3 & 0x3f;
  if (uVar8 != 0) {
    __n = (ulong)(0x40 - uVar8);
    __dest = (void *)((long)context->buffer + (ulong)uVar8);
    if (len < __n) {
      memcpy(__dest,data,len);
      goto LAB_0012af58;
    }
    memcpy(__dest,data,__n);
    context->bitcount = context->bitcount + (ulong)((0x40 - uVar8) * 8);
    lVar9 = 10;
    do {
      uVar8 = context->state[lVar9];
      context->state[lVar9] =
           uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x1a);
    data = data + __n;
    sha256_Transform(context->state,context->buffer,context->state);
    len = len - __n;
  }
  if (0x3f < len) {
    do {
      uVar1 = *(undefined8 *)data;
      uVar2 = *(undefined8 *)(data + 8);
      uVar3 = *(undefined8 *)(data + 0x10);
      uVar4 = *(undefined8 *)(data + 0x18);
      uVar5 = *(undefined8 *)(data + 0x20);
      uVar6 = *(undefined8 *)(data + 0x28);
      uVar7 = *(undefined8 *)(data + 0x38);
      *(undefined8 *)(context->buffer + 0xc) = *(undefined8 *)(data + 0x30);
      *(undefined8 *)(context->buffer + 0xe) = uVar7;
      *(undefined8 *)(context->buffer + 8) = uVar5;
      *(undefined8 *)(context->buffer + 10) = uVar6;
      *(undefined8 *)(context->buffer + 4) = uVar3;
      *(undefined8 *)(context->buffer + 6) = uVar4;
      *(undefined8 *)context->buffer = uVar1;
      *(undefined8 *)(context->buffer + 2) = uVar2;
      lVar9 = 10;
      do {
        uVar8 = context->state[lVar9];
        context->state[lVar9] =
             uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x1a);
      sha256_Transform(context->state,context->buffer,context->state);
      context->bitcount = context->bitcount + 0x200;
      len = len - 0x40;
      data = data + 0x40;
    } while (0x3f < len);
  }
  if (len == 0) {
    return;
  }
  memcpy(context->buffer,data,len);
LAB_0012af58:
  context->bitcount = context->bitcount + len * 8;
  return;
}

Assistant:

void sha256_Update(trezor::SHA256_CTX* context, const sha2_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	usedspace = (context->bitcount >> 3) % SHA256_BLOCK_LENGTH;
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = SHA256_BLOCK_LENGTH - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(((uint8_t*)context->buffer) + usedspace, data, freespace);
			context->bitcount += freespace << 3;
			len -= freespace;
			data += freespace;
#if BYTE_ORDER == LITTLE_ENDIAN
			/* Convert TO host byte order */
			for (int j = 0; j < 16; j++) {
				REVERSE32(context->buffer[j],context->buffer[j]);
			}
#endif
			sha256_Transform(context->state, context->buffer, context->state);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(((uint8_t*)context->buffer) + usedspace, data, len);
			context->bitcount += len << 3;
			/* Clean up: */
			usedspace = freespace = 0;
			return;
		}
	}
	while (len >= SHA256_BLOCK_LENGTH) {
		/* Process as many complete blocks as we can */
		MEMCPY_BCOPY(context->buffer, data, SHA256_BLOCK_LENGTH);
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		for (int j = 0; j < 16; j++) {
			REVERSE32(context->buffer[j],context->buffer[j]);
		}
#endif
		sha256_Transform(context->state, context->buffer, context->state);
		context->bitcount += SHA256_BLOCK_LENGTH << 3;
		len -= SHA256_BLOCK_LENGTH;
		data += SHA256_BLOCK_LENGTH;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->buffer, data, len);
		context->bitcount += len << 3;
	}
}